

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O0

SquaredEuclideanDistance * __thiscall
CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance
          (NearestNeighborsIndex *this)

{
  bool bVar1;
  SquaredEuclideanDistance *this_00;
  NearestNeighborsIndex *this_local;
  
  bVar1 = has_squaredeuclideandistance(this);
  if (!bVar1) {
    clear_DistanceFunction(this);
    set_has_squaredeuclideandistance(this);
    this_00 = (SquaredEuclideanDistance *)operator_new(0x18);
    SquaredEuclideanDistance::SquaredEuclideanDistance(this_00);
    (this->DistanceFunction_).squaredeuclideandistance_ = this_00;
  }
  return (this->DistanceFunction_).squaredeuclideandistance_;
}

Assistant:

inline ::CoreML::Specification::SquaredEuclideanDistance* NearestNeighborsIndex::mutable_squaredeuclideandistance() {
  if (!has_squaredeuclideandistance()) {
    clear_DistanceFunction();
    set_has_squaredeuclideandistance();
    DistanceFunction_.squaredeuclideandistance_ = new ::CoreML::Specification::SquaredEuclideanDistance;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NearestNeighborsIndex.squaredEuclideanDistance)
  return DistanceFunction_.squaredeuclideandistance_;
}